

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int parseHhMmSs(char *zDate,DateTime *p)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  byte *zDate_00;
  byte *pbVar5;
  double dVar6;
  double dVar7;
  int s;
  int m;
  int h;
  int nMn;
  int nHr;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  iVar2 = getDigits(zDate,"20c:20e",&local_34,&local_38);
  if (iVar2 != 2) {
    return 1;
  }
  if (zDate[5] == ':') {
    iVar2 = getDigits(zDate + 6,"20e",&local_3c);
    if (iVar2 != 1) {
      return 1;
    }
    zDate_00 = (byte *)(zDate + 8);
    dVar6 = 0.0;
    if ((zDate[8] == '.') && (0xfffffffffffffff5 < (ulong)(byte)zDate[9] - 0x3a)) {
      zDate_00 = (byte *)(zDate + 9);
      uVar4 = (ulong)*zDate_00;
      if (0xfffffffffffffff5 < uVar4 - 0x3a) {
        dVar7 = 1.0;
        do {
          dVar6 = dVar6 * 10.0 + (double)(int)(char)uVar4 + -48.0;
          dVar7 = dVar7 * 10.0;
          uVar4 = (ulong)zDate_00[1];
          zDate_00 = zDate_00 + 1;
        } while (0xfffffffffffffff5 < uVar4 - 0x3a);
        dVar6 = dVar6 / dVar7;
      }
    }
  }
  else {
    zDate_00 = (byte *)(zDate + 5);
    local_3c = 0;
    dVar6 = 0.0;
  }
  p->validJD = '\0';
  p->rawS = '\0';
  p->validHMS = '\x01';
  p->h = local_34;
  p->m = local_38;
  p->s = (double)local_3c + dVar6;
  do {
    pbVar5 = zDate_00;
    zDate_00 = pbVar5 + 1;
  } while ((""[*pbVar5] & 1) != 0);
  p->tz = 0;
  bVar1 = *pbVar5;
  if (bVar1 == 0x2d) {
    iVar2 = -1;
LAB_001822ba:
    iVar3 = getDigits((char *)zDate_00,"20b:20e",&local_2c,&local_30);
    if (iVar3 != 2) {
      return 1;
    }
    p->tz = (local_2c * 0x3c + local_30) * iVar2;
    zDate_00 = pbVar5 + 6;
  }
  else {
    if (bVar1 == 0x2b) {
      iVar2 = 1;
      goto LAB_001822ba;
    }
    if ((bVar1 & 0xdf) != 0x5a) goto LAB_00182310;
  }
  do {
    pbVar5 = zDate_00;
    zDate_00 = pbVar5 + 1;
  } while ((""[*pbVar5] & 1) != 0);
  p->tzSet = '\x01';
  bVar1 = *pbVar5;
LAB_00182310:
  if (bVar1 == 0) {
    p->validTZ = p->tz != 0;
  }
  return (uint)(bVar1 != 0);
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, "20c:20e", &h, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, "20e", &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->rawS = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  p->validTZ = (p->tz!=0)?1:0;
  return 0;
}